

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaPCustomAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlChar **ownerDes,
               xmlSchemaBasicItemPtr ownerItem,xmlAttrPtr attr,char *msg)

{
  xmlChar *local_48;
  xmlChar *des;
  char *msg_local;
  xmlAttrPtr attr_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlChar **ownerDes_local;
  xmlSchemaParserCtxtPtr pxStack_18;
  xmlParserErrors error_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  local_48 = (xmlChar *)0x0;
  des = (xmlChar *)msg;
  msg_local = (char *)attr;
  attr_local = (xmlAttrPtr)ownerItem;
  ownerItem_local = (xmlSchemaBasicItemPtr)ownerDes;
  ownerDes_local._4_4_ = error;
  pxStack_18 = ctxt;
  if (ownerDes == (xmlChar **)0x0) {
    xmlSchemaFormatItemForReport(&local_48,(xmlChar *)0x0,ownerItem,attr->parent);
  }
  else if (*ownerDes == (xmlChar *)0x0) {
    xmlSchemaFormatItemForReport(ownerDes,(xmlChar *)0x0,ownerItem,attr->parent);
    local_48 = *(xmlChar **)ownerItem_local;
  }
  else {
    local_48 = *ownerDes;
  }
  if (msg_local == (char *)0x0) {
    xmlSchemaPErrExt(pxStack_18,(xmlNodePtr)0x0,ownerDes_local._4_4_,(xmlChar *)0x0,(xmlChar *)0x0,
                     (xmlChar *)0x0,"%s, attribute \'%s\': %s.\n",local_48,(xmlChar *)"Unknown",des,
                     (xmlChar *)0x0,(xmlChar *)0x0);
  }
  else {
    xmlSchemaPErrExt(pxStack_18,(xmlNodePtr)msg_local,ownerDes_local._4_4_,(xmlChar *)0x0,
                     (xmlChar *)0x0,(xmlChar *)0x0,"%s, attribute \'%s\': %s.\n",local_48,
                     *(xmlChar **)(msg_local + 0x10),des,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  if ((ownerItem_local == (xmlSchemaBasicItemPtr)0x0) && (local_48 != (xmlChar *)0x0)) {
    (*xmlFree)(local_48);
  }
  return;
}

Assistant:

static void
xmlSchemaPCustomAttrErr(xmlSchemaParserCtxtPtr ctxt,
			xmlParserErrors error,
			xmlChar **ownerDes,
			xmlSchemaBasicItemPtr ownerItem,
			xmlAttrPtr attr,
			const char *msg)
{
    xmlChar *des = NULL;

    if (ownerDes == NULL)
	xmlSchemaFormatItemForReport(&des, NULL, ownerItem, attr->parent);
    else if (*ownerDes == NULL) {
	xmlSchemaFormatItemForReport(ownerDes, NULL, ownerItem, attr->parent);
	des = *ownerDes;
    } else
	des = *ownerDes;
    if (attr == NULL) {
	xmlSchemaPErrExt(ctxt, NULL, error, NULL, NULL, NULL,
	    "%s, attribute '%s': %s.\n",
	    BAD_CAST des, (const xmlChar *) "Unknown",
	    (const xmlChar *) msg, NULL, NULL);
    } else {
	xmlSchemaPErrExt(ctxt, (xmlNodePtr) attr, error, NULL, NULL, NULL,
	    "%s, attribute '%s': %s.\n",
	    BAD_CAST des, attr->name, (const xmlChar *) msg, NULL, NULL);
    }
    if (ownerDes == NULL)
	FREE_AND_NULL(des);
}